

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts2cb.c
# Opt level: O3

uint32 * cont_ts2cb(uint32 n_ts)

{
  undefined1 auVar1 [16];
  uint32 *puVar2;
  ulong uVar3;
  ulong n_elem;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  n_elem = (ulong)n_ts;
  puVar2 = (uint32 *)
           __ckd_calloc__(n_elem,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ts2cb.c"
                          ,0x3e);
  auVar1 = _DAT_0011ec90;
  if (n_ts != 0) {
    lVar4 = n_elem - 1;
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_0011ec90;
    auVar6 = _DAT_0011ec80;
    do {
      auVar7 = auVar6 ^ auVar1;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        puVar2[uVar3] = (uint32)uVar3;
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        puVar2[uVar3 + 1] = (uint32)uVar3 + 1;
      }
      uVar3 = uVar3 + 2;
      lVar4 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar4 + 2;
    } while ((n_elem + 1 & 0xfffffffffffffffe) != uVar3);
  }
  return puVar2;
}

Assistant:

uint32 *
cont_ts2cb(uint32 n_ts)
{
    uint32 *out, i;

    out = ckd_calloc(n_ts, sizeof(uint32));
    for (i = 0; i < n_ts; i++) {
	out[i] = i;
    }

    return out;
}